

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::Event>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  DeviceInterface *vk;
  VkDevice device;
  Unique<vk::Handle<(vk::HandleType)10>_> obj;
  VkEvent local_78;
  undefined1 auStack_70 [8];
  VkDevice local_68;
  VkAllocationCallbacks *pVStack_60;
  Move<vk::Handle<(vk::HandleType)10>_> local_50;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  local_78.m_internal._0_4_ = VK_STRUCTURE_TYPE_EVENT_CREATE_INFO;
  auStack_70 = (undefined1  [8])0x0;
  local_68 = (VkDevice)CONCAT44(local_68._4_4_,params.flags);
  ::vk::createEvent(&local_50,vk,device,(VkEventCreateInfo *)&local_78,(VkAllocationCallbacks *)0x0)
  ;
  local_78.m_internal._4_4_ =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal._4_4_;
  local_78.m_internal._0_4_ =
       (undefined4)local_50.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  auStack_70._4_4_ =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface._4_4_;
  auStack_70._0_4_ =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface._0_4_;
  local_68 = local_50.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
  pVStack_60 = local_50.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)10>_> *)auStack_70,local_78);
  }
  local_78.m_internal = (deUint64)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_78.m_internal,
             (long)(_func_int ***)auStack_70 + local_78.m_internal);
  if ((VkDevice *)local_78.m_internal != &local_68) {
    operator_delete((void *)local_78.m_internal,(ulong)(local_68 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}